

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O1

bool __thiscall Sphere::intersect(Sphere *this,Ray *ray,double *t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  SphereTestCount = SphereTestCount + 1;
  dVar1 = (this->loc).x - (ray->org).x;
  dVar2 = (this->loc).y - (ray->org).y;
  dVar3 = (this->loc).z - (ray->org).z;
  dVar4 = dVar3 * (ray->dir).z + dVar1 * (ray->dir).x + dVar2 * (ray->dir).y;
  dVar1 = dVar4 * dVar4 + (this->radius2 - (dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2));
  if (0.0 < dVar1) {
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    if (dVar1 <= dVar4) {
      *t = dVar4 - dVar1;
      dVar4 = dVar4 + dVar1;
    }
    else {
      *t = dVar4 + dVar1;
      dVar4 = dVar4 - dVar1;
    }
    if (ABS(*t) < geom_threshold) {
      *t = dVar4;
    }
    if (geom_threshold < *t) {
      return true;
    }
  }
  SphereTestMisses = SphereTestMisses + 1;
  return false;
}

Assistant:

bool Sphere::intersect(Ray& ray, double& t)
{
   STAT( SphereTestCount++  );

   Vector l = loc - ray.org;
   double l20c = l   & l;
   double tca = l & ray.dir;
   double t2hc = radius2 - l20c + tca * tca;
   double t2;

   if(   t2hc <=  0.0   )
   {
      STAT( SphereTestMisses++ );
      return false;
   }

   t2hc = sqrt(t2hc);

   if(   tca   < t2hc)  // we are inside
   {
      t  = tca + t2hc;
      t2 = tca - t2hc;
   }
   else        // we are outside
   {
      t  = tca - t2hc;
      t2 = tca + t2hc;
   }

   if(   fabs(t)  < geom_threshold ) t = t2;

   if(   t >   geom_threshold )
      return true;
   else
   {
      STAT(SphereTestMisses++);
      return false;
   }
}